

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushID(int int_id)

{
  ImGuiWindow *this;
  ImGuiID id;
  ImGuiID local_c;
  
  this = GImGui->CurrentWindow;
  local_c = ImGuiWindow::GetID(this,int_id);
  ImVector<unsigned_int>::push_back(&this->IDStack,&local_c);
  return;
}

Assistant:

void ImGui::PushID(int int_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetID(int_id);
    window->IDStack.push_back(id);
}